

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_posix::collator<wchar_t>::do_transform_abi_cxx11_
          (string_type *__return_storage_ptr__,collator<wchar_t> *this,char_type_conflict *b,
          char_type_conflict *e)

{
  size_t __new_size;
  vector<wchar_t,_std::allocator<wchar_t>_> buf;
  string_type s;
  allocator_type local_51;
  _Vector_base<wchar_t,_std::allocator<wchar_t>_> local_50;
  wchar_t *local_38 [2];
  wchar_t local_28 [4];
  
  local_38[0] = local_28;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_38,b,e);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_50,((long)e - (long)b >> 1) + 1,
             &local_51);
  __new_size = wcsxfrm_l(local_50._M_impl.super__Vector_impl_data._M_start,local_38[0],
                         (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_50._M_impl.super__Vector_impl_data._M_start >> 2,
                         (__locale_t)
                         *(this->lc_).
                          super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((ulong)((long)local_50._M_impl.super__Vector_impl_data._M_finish -
              (long)local_50._M_impl.super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<wchar_t,_std::allocator<wchar_t>_>::resize
              ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_50,__new_size);
    wcsxfrm_l(local_50._M_impl.super__Vector_impl_data._M_start,local_38[0],__new_size,
              (__locale_t)
              *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_start + __new_size);
  std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base(&local_50);
  std::__cxx11::wstring::~wstring((wstring *)local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual string_type do_transform(char_type const *b,char_type const *e) const
    {
        string_type s(b,e-b);
        std::vector<char_type> buf((e-b)*2+1);
        size_t n = coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),buf.size(),*lc_);
        if(n>buf.size()) {
            buf.resize(n);
            coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),n,*lc_);
        }
        return string_type(&buf.front(),n);
    }